

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_circle.cpp
# Opt level: O2

bool __thiscall ON_Circle::Create(ON_Circle *this,ON_Plane *p,double r)

{
  bool bVar1;
  long lVar2;
  ON_Circle *pOVar3;
  
  pOVar3 = this;
  for (lVar2 = 0x10; lVar2 != 0; lVar2 = lVar2 + -1) {
    (pOVar3->plane).origin.x = (p->origin).x;
    p = (ON_Plane *)&(p->origin).y;
    pOVar3 = (ON_Circle *)&(pOVar3->plane).origin.y;
  }
  bVar1 = ON_Plane::IsValid(&this->plane);
  if (!bVar1) {
    ON_Plane::UpdateEquation(&this->plane);
  }
  this->radius = r;
  return 0.0 < r;
}

Assistant:

bool ON_Circle::Create( const ON_Plane& p, double r )
{
  plane = p;
  if ( !plane.IsValid() )
    plane.UpdateEquation(); // people often forget to set equation
  radius = r;
  //m_point[0] = plane.PointAt( radius, 0.0 );
  //m_point[1] = plane.PointAt( 0.0, radius );
  //m_point[2] = plane.PointAt( -radius, 0.0 );
  return ( radius > 0.0 );
}